

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::LinearQuantizationParams::_internal_add_bias
          (LinearQuantizationParams *this,float value)

{
  float local_14;
  LinearQuantizationParams *pLStack_10;
  float value_local;
  LinearQuantizationParams *this_local;
  
  local_14 = value;
  pLStack_10 = this;
  google::protobuf::RepeatedField<float>::Add(&this->bias_,&local_14);
  return;
}

Assistant:

inline void LinearQuantizationParams::_internal_add_bias(float value) {
  bias_.Add(value);
}